

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_compress_fast_extState
              (void *state,char *source,char *dest,int inputSize,int maxOutputSize,int acceleration)

{
  ulong *puVar1;
  short sVar2;
  char cVar3;
  BYTE *d;
  long *plVar4;
  char *pcVar5;
  long lVar6;
  short *psVar7;
  char cVar8;
  uint uVar9;
  uint uVar10;
  int *piVar11;
  ulong uVar12;
  int *piVar13;
  int iVar14;
  long lVar15;
  long *plVar16;
  char *pcVar17;
  long *plVar18;
  ulong *puVar19;
  long lVar20;
  int iVar21;
  int *piVar22;
  ulong *puVar23;
  long lVar24;
  long *plVar25;
  ulong uVar26;
  char *pcVar27;
  BYTE *e_3;
  short *psVar28;
  BYTE *e;
  short *psVar29;
  int iVar30;
  U16 *hashTable;
  short *local_80;
  int local_70;
  
  iVar30 = 0;
  if (((ulong)state & 7) == 0 && state != (void *)0x0) {
    memset(state,0,0x4020);
  }
  else {
    state = (void *)0x0;
  }
  if (acceleration < 2) {
    acceleration = 1;
  }
  if ((uint)inputSize < 0x7e000001) {
    iVar30 = inputSize + (uint)inputSize / 0xff + 0x10;
  }
  uVar9 = *(uint *)((long)state + 0x4000);
  lVar20 = (long)source - (ulong)uVar9;
  iVar14 = (int)lVar20;
  sVar2 = (short)lVar20;
  local_70 = (int)dest;
  if (maxOutputSize < iVar30) {
    pcVar17 = dest + maxOutputSize;
    if (inputSize < 0x1000b) {
      if ((uint)inputSize < 0x7e000001) {
        *(int *)((long)state + 0x4018) = *(int *)((long)state + 0x4018) + inputSize;
        *(uint *)((long)state + 0x4000) = uVar9 + inputSize;
        *(undefined2 *)((long)state + 0x4006) = 3;
        piVar22 = (int *)source;
        if (0xc < (uint)inputSize) {
          *(short *)((long)state + (ulong)((uint)(*(int *)source * -0x61c8864f) >> 0x13) * 2) =
               (short)uVar9;
          local_80 = (short *)dest;
LAB_00109ea1:
          iVar21 = 1;
          iVar30 = *(int *)((long)piVar22 + 1);
          piVar11 = (int *)((long)piVar22 + 1);
          iVar14 = acceleration << 6;
          do {
            piVar13 = piVar11;
            piVar11 = (int *)((long)iVar21 + (long)piVar13);
            dest = (char *)local_80;
            if (source + (long)inputSize + -0xb < piVar11) goto LAB_0010a507;
            iVar21 = iVar14 >> 6;
            iVar14 = iVar14 + 1;
            uVar26 = (ulong)((uint)(iVar30 * -0x61c8864f) >> 0x13);
            uVar12 = (ulong)*(ushort *)((long)state + uVar26 * 2);
            iVar30 = *piVar11;
            *(short *)((long)state + uVar26 * 2) = (short)piVar13 - sVar2;
          } while (*(int *)(lVar20 + uVar12) != *piVar13);
          lVar6 = uVar12 + lVar20;
          lVar24 = 0;
          cVar3 = (char)piVar13 * '\x10' + (char)piVar22 * -0x10;
          do {
            cVar8 = cVar3;
            lVar15 = lVar24;
            pcVar27 = (char *)(lVar6 + lVar15);
            piVar11 = (int *)((long)piVar13 + lVar15);
            if ((pcVar27 <= source) || (piVar11 <= piVar22)) break;
            lVar24 = lVar15 + -1;
            cVar3 = cVar8 + -0x10;
          } while (*(char *)((long)piVar13 + lVar15 + -1) == *(char *)(lVar6 + -1 + lVar15));
          uVar9 = (int)piVar13 - (int)piVar22;
          uVar26 = (ulong)(uVar9 + (int)lVar15);
          uVar12 = (ulong)uVar9 + lVar15;
          if (pcVar17 < (char *)((long)local_80 + (uVar12 & 0xffffffff) / 0xff + uVar26 + 9)) {
            return 0;
          }
          if ((uint)uVar12 < 0xf) {
            psVar7 = (short *)((long)local_80 + 1);
            *(char *)local_80 = cVar8;
          }
          else {
            *(char *)local_80 = -0x10;
            psVar7 = local_80 + 1;
            for (iVar30 = ((int)piVar13 - (int)piVar22) + (int)lVar15 + -0xf; 0xfe < iVar30;
                iVar30 = iVar30 + -0xff) {
              *(char *)((long)psVar7 + -1) = -1;
              psVar7 = (short *)((long)psVar7 + 1);
            }
            *(char *)((long)psVar7 + -1) = (char)iVar30;
          }
          psVar29 = (short *)(uVar26 + (long)psVar7);
          do {
            *(undefined8 *)psVar7 = *(undefined8 *)piVar22;
            psVar7 = psVar7 + 4;
            piVar22 = piVar22 + 2;
          } while (psVar7 < psVar29);
          do {
            *psVar29 = (short)piVar11 - (short)pcVar27;
            puVar1 = (ulong *)(piVar11 + 1);
            puVar23 = (ulong *)(pcVar27 + 4);
            puVar19 = puVar1;
            if (source + (long)inputSize + -0xc <= puVar1) {
LAB_0010a04f:
              iVar30 = ((int)puVar19 - (int)piVar11) + -4;
LAB_0010a056:
              if (puVar19 < source + (long)inputSize + -0xc) {
                if (*puVar23 == *puVar19) goto code_r0x0010a06a;
                uVar26 = *puVar19 ^ *puVar23;
                uVar12 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                  }
                }
                uVar9 = ((uint)(uVar12 >> 3) & 0x1fffffff) + iVar30;
              }
              else {
                if ((puVar19 < source + (long)inputSize + -8) && ((int)*puVar23 == (int)*puVar19)) {
                  puVar19 = (ulong *)((long)puVar19 + 4);
                  puVar23 = (ulong *)((long)puVar23 + 4);
                }
                if ((puVar19 < source + (long)inputSize + -6) &&
                   ((short)*puVar23 == (short)*puVar19)) {
                  puVar19 = (ulong *)((long)puVar19 + 2);
                  puVar23 = (ulong *)((long)puVar23 + 2);
                }
                if (puVar19 < source + (long)inputSize + -5) {
                  puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar23 == (char)*puVar19));
                }
                uVar9 = (int)puVar19 - (int)puVar1;
              }
              goto LAB_0010a08f;
            }
            if (*puVar23 == *puVar1) {
              puVar23 = (ulong *)(pcVar27 + 0xc);
              puVar19 = (ulong *)(piVar11 + 3);
              goto LAB_0010a04f;
            }
            uVar12 = *puVar1 ^ *puVar23;
            lVar24 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
              }
            }
            uVar9 = (uint)lVar24 >> 3;
LAB_0010a08f:
            if (pcVar17 < (char *)((long)psVar29 + (ulong)(uVar9 + 0xf0) / 0xff + 8)) {
              return 0;
            }
            dest = (char *)(psVar29 + 1);
            if (uVar9 < 0xf) {
              *(char *)local_80 = (char)*local_80 + (char)uVar9;
            }
            else {
              *(char *)local_80 = (char)*local_80 + '\x0f';
              *(short *)((long)dest + 0) = -1;
              *(short *)((long)dest + 2) = -1;
              lVar24 = 0;
              for (uVar10 = uVar9 - 0xf; 0x3fb < uVar10; uVar10 = uVar10 - 0x3fc) {
                pcVar27 = (char *)((long)psVar29 + lVar24 + 6);
                pcVar27[0] = -1;
                pcVar27[1] = -1;
                pcVar27[2] = -1;
                pcVar27[3] = -1;
                lVar24 = lVar24 + 4;
              }
              lVar6 = lVar24 + ((ulong)uVar10 & 0xffff) / 0xff;
              dest = (char *)((long)psVar29 + lVar6 + 3);
              *(char *)((long)psVar29 + lVar6 + 2) =
                   (char)lVar24 + (char)((uVar10 & 0xffff) / 0xff) + (char)uVar9 + -0xf;
            }
            lVar24 = (long)piVar11 + (ulong)uVar9;
            piVar11 = (int *)(lVar24 + 4);
            piVar22 = piVar11;
            if (source + (long)inputSize + -0xb <= piVar11) break;
            *(short *)((long)state + (ulong)((uint)(*(int *)(lVar24 + 2) * -0x61c8864f) >> 0x13) * 2
                      ) = ((short)lVar24 + 2) - sVar2;
            uVar12 = (ulong)((uint)(*piVar11 * -0x61c8864f) >> 0x13);
            uVar26 = (ulong)*(ushort *)((long)state + uVar12 * 2);
            pcVar27 = (char *)(lVar20 + uVar26);
            *(short *)((long)state + uVar12 * 2) = (short)piVar11 - sVar2;
            local_80 = (short *)dest;
            if (*(int *)(lVar20 + uVar26) != *piVar11) goto LAB_00109ea1;
            psVar29 = (short *)((long)dest + 1);
            *dest = '\0';
          } while( true );
        }
LAB_0010a507:
        pcVar27 = source + ((long)inputSize - (long)piVar22);
        if (pcVar17 < (char *)((long)dest + (long)(pcVar27 + (ulong)(pcVar27 + 0xf0) / 0xff + 1))) {
          return 0;
        }
        if (pcVar27 < (char *)0xf) {
          *dest = (char)pcVar27 << 4;
        }
        else {
          *dest = -0x10;
          for (pcVar17 = pcVar27 + -0xf; dest = (char *)((long)dest + 1), (char *)0xfe < pcVar17;
              pcVar17 = pcVar17 + -0xff) {
            *dest = -1;
          }
          *dest = (char)pcVar17;
        }
        memcpy((char *)((long)dest + 1),piVar22,(size_t)pcVar27);
        iVar30 = (int)(char *)((long)dest + 1) + (int)pcVar27;
        goto LAB_0010a5a7;
      }
    }
    else if ((uint)inputSize < 0x7e000001) {
      *(int *)((long)state + 0x4018) = *(int *)((long)state + 0x4018) + inputSize;
      *(uint *)((long)state + 0x4000) = inputSize + uVar9;
      *(undefined2 *)((long)state + 0x4006) = 2;
      *(uint *)((long)state + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) = uVar9;
      plVar18 = (long *)source;
LAB_00109741:
      iVar21 = 1;
      lVar24 = *(long *)((long)plVar18 + 1);
      plVar4 = (long *)((long)plVar18 + 1);
      iVar30 = acceleration << 6;
      while( true ) {
        plVar25 = (long *)((long)iVar21 + (long)plVar4);
        plVar16 = plVar18;
        if (source + ((ulong)(uint)inputSize - 0xb) < plVar25) goto LAB_00109de1;
        uVar12 = (ulong)(lVar24 * -0x30e4432345000000) >> 0x34;
        uVar9 = *(uint *)((long)state + uVar12 * 4);
        iVar21 = (int)plVar4;
        lVar24 = *plVar25;
        *(int *)((long)state + uVar12 * 4) = iVar21 - iVar14;
        if (((uint)(iVar21 - iVar14) <= uVar9 + 0xffff) &&
           (*(int *)(lVar20 + (ulong)uVar9) == (int)*plVar4)) break;
        iVar21 = iVar30 >> 6;
        iVar30 = iVar30 + 1;
        plVar4 = plVar25;
      }
      lVar6 = (ulong)uVar9 + lVar20;
      lVar24 = 0;
      cVar3 = (char)plVar4 * '\x10' + (char)plVar18 * -0x10;
      do {
        cVar8 = cVar3;
        lVar15 = lVar24;
        piVar22 = (int *)(lVar6 + lVar15);
        plVar16 = (long *)((long)plVar4 + lVar15);
        if ((piVar22 <= source) || (plVar16 <= plVar18)) break;
        lVar24 = lVar15 + -1;
        cVar3 = cVar8 + -0x10;
      } while (*(char *)((long)plVar4 + lVar15 + -1) == *(char *)(lVar6 + -1 + lVar15));
      uVar9 = iVar21 - (int)plVar18;
      uVar12 = (ulong)(uVar9 + (int)lVar15);
      uVar26 = (ulong)uVar9 + lVar15;
      if (pcVar17 < dest + (uVar26 & 0xffffffff) / 0xff + uVar12 + 9) {
        return 0;
      }
      if ((uint)uVar26 < 0xf) {
        plVar4 = (long *)(dest + 1);
        *dest = cVar8;
      }
      else {
        *dest = -0x10;
        plVar4 = (long *)(dest + 2);
        for (iVar30 = (iVar21 - (int)plVar18) + (int)lVar15 + -0xf; 0xfe < iVar30;
            iVar30 = iVar30 + -0xff) {
          *(char *)((long)plVar4 + -1) = -1;
          plVar4 = (long *)((long)plVar4 + 1);
        }
        *(char *)((long)plVar4 + -1) = (char)iVar30;
      }
      plVar25 = (long *)(uVar12 + (long)plVar4);
      do {
        *plVar4 = *plVar18;
        plVar4 = plVar4 + 1;
        plVar18 = plVar18 + 1;
        pcVar27 = dest;
      } while (plVar4 < plVar25);
      do {
        *(short *)plVar25 = (short)plVar16 - (short)piVar22;
        puVar1 = (ulong *)((long)plVar16 + 4);
        puVar23 = (ulong *)(piVar22 + 1);
        puVar19 = puVar1;
        if (source + ((ulong)(uint)inputSize - 0xc) <= puVar1) {
LAB_001098fc:
          iVar30 = ((int)puVar19 - (int)plVar16) + -4;
LAB_00109903:
          if (puVar19 < source + ((ulong)(uint)inputSize - 0xc)) {
            if (*puVar23 == *puVar19) goto code_r0x00109917;
            uVar26 = *puVar19 ^ *puVar23;
            uVar12 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
              }
            }
            uVar9 = ((uint)(uVar12 >> 3) & 0x1fffffff) + iVar30;
          }
          else {
            if ((puVar19 < source + ((ulong)(uint)inputSize - 8)) &&
               ((int)*puVar23 == (int)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 4);
              puVar23 = (ulong *)((long)puVar23 + 4);
            }
            if ((puVar19 < source + ((ulong)(uint)inputSize - 6)) &&
               ((short)*puVar23 == (short)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 2);
              puVar23 = (ulong *)((long)puVar23 + 2);
            }
            if (puVar19 < source + ((ulong)(uint)inputSize - 5)) {
              puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar23 == (char)*puVar19));
            }
            uVar9 = (int)puVar19 - (int)puVar1;
          }
          goto LAB_0010993c;
        }
        if (*puVar23 == *puVar1) {
          puVar23 = (ulong *)(piVar22 + 3);
          puVar19 = (ulong *)((long)plVar16 + 0xc);
          goto LAB_001098fc;
        }
        uVar12 = *puVar1 ^ *puVar23;
        lVar24 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
          }
        }
        uVar9 = (uint)lVar24 >> 3;
LAB_0010993c:
        if (pcVar17 < (char *)((long)plVar25 + (ulong)(uVar9 + 0xf0) / 0xff + 8)) {
          return 0;
        }
        dest = (char *)((long)plVar25 + 2);
        if (uVar9 < 0xf) {
          *pcVar27 = *pcVar27 + (char)uVar9;
        }
        else {
          *pcVar27 = *pcVar27 + '\x0f';
          dest[0] = -1;
          dest[1] = -1;
          dest[2] = -1;
          dest[3] = -1;
          lVar24 = 0;
          for (uVar10 = uVar9 - 0xf; 0x3fb < uVar10; uVar10 = uVar10 - 0x3fc) {
            pcVar27 = (char *)((long)plVar25 + lVar24 + 6);
            pcVar27[0] = -1;
            pcVar27[1] = -1;
            pcVar27[2] = -1;
            pcVar27[3] = -1;
            lVar24 = lVar24 + 4;
          }
          lVar6 = lVar24 + ((ulong)uVar10 & 0xffff) / 0xff;
          dest = (char *)((long)plVar25 + lVar6 + 3);
          *(char *)((long)plVar25 + lVar6 + 2) =
               (char)lVar24 + (char)((uVar10 & 0xffff) / 0xff) + (char)uVar9 + -0xf;
        }
        lVar24 = (long)plVar16 + (ulong)uVar9;
        plVar16 = (long *)(lVar24 + 4);
        if (source + ((ulong)(uint)inputSize - 0xb) <= plVar16) goto LAB_00109de1;
        *(int *)((long)state + ((ulong)(*(long *)(lVar24 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
             ((int)lVar24 + 2) - iVar14;
        uVar12 = (ulong)(*plVar16 * -0x30e4432345000000) >> 0x34;
        uVar10 = (int)plVar16 - iVar14;
        uVar9 = *(uint *)((long)state + uVar12 * 4);
        piVar22 = (int *)((ulong)uVar9 + lVar20);
        *(uint *)((long)state + uVar12 * 4) = uVar10;
        plVar18 = plVar16;
        if ((uVar9 + 0xffff < uVar10) || (*piVar22 != *(int *)plVar16)) goto LAB_00109741;
        plVar25 = (long *)(dest + 1);
        *dest = '\0';
        pcVar27 = dest;
      } while( true );
    }
  }
  else if (inputSize < 0x1000b) {
    if ((uint)inputSize < 0x7e000001) {
      *(int *)((long)state + 0x4018) = *(int *)((long)state + 0x4018) + inputSize;
      *(uint *)((long)state + 0x4000) = uVar9 + inputSize;
      *(undefined2 *)((long)state + 0x4006) = 3;
      piVar22 = (int *)source;
      if ((uint)inputSize < 0xd) {
LAB_0010a4a4:
        pcVar17 = source + ((long)inputSize - (long)piVar22);
        if (pcVar17 < (char *)0xf) {
          *dest = (char)pcVar17 << 4;
        }
        else {
          *dest = -0x10;
          for (pcVar27 = pcVar17 + -0xf; dest = (char *)((long)dest + 1), (char *)0xfe < pcVar27;
              pcVar27 = pcVar27 + -0xff) {
            *dest = -1;
          }
          *dest = (char)pcVar27;
        }
        memcpy((char *)((long)dest + 1),piVar22,(size_t)pcVar17);
        return ((int)(char *)((long)dest + 1) + (int)pcVar17) - local_70;
      }
      *(short *)((long)state + (ulong)((uint)(*(int *)source * -0x61c8864f) >> 0x13) * 2) =
           (short)uVar9;
LAB_0010a1ec:
      iVar21 = 1;
      iVar30 = *(int *)((long)piVar22 + 1);
      piVar11 = (int *)((long)piVar22 + 1);
      iVar14 = acceleration << 6;
      do {
        piVar13 = piVar11;
        piVar11 = (int *)((long)iVar21 + (long)piVar13);
        if (source + (long)inputSize + -0xb < piVar11) goto LAB_0010a4a4;
        iVar21 = iVar14 >> 6;
        iVar14 = iVar14 + 1;
        uVar26 = (ulong)((uint)(iVar30 * -0x61c8864f) >> 0x13);
        uVar12 = (ulong)*(ushort *)((long)state + uVar26 * 2);
        iVar30 = *piVar11;
        *(short *)((long)state + uVar26 * 2) = (short)piVar13 - sVar2;
      } while (*(int *)(lVar20 + uVar12) != *piVar13);
      lVar6 = uVar12 + lVar20;
      iVar30 = (int)piVar22;
      lVar24 = 0;
      cVar3 = (char)piVar13 * '\x10' + (char)piVar22 * -0x10;
      do {
        cVar8 = cVar3;
        lVar15 = lVar24;
        pcVar17 = (char *)(lVar6 + lVar15);
        piVar11 = (int *)((long)piVar13 + lVar15);
        if ((pcVar17 <= source) || (piVar11 <= piVar22)) break;
        lVar24 = lVar15 + -1;
        cVar3 = cVar8 + -0x10;
      } while (*(char *)((long)piVar13 + lVar15 + -1) == *(char *)(lVar6 + -1 + lVar15));
      if ((uint)(((int)piVar13 - iVar30) + (int)lVar15) < 0xf) {
        psVar7 = (short *)((long)dest + 1);
        *dest = cVar8;
      }
      else {
        *dest = -0x10;
        psVar7 = (short *)((long)dest + 2);
        for (iVar14 = ((int)piVar13 - iVar30) + (int)lVar15 + -0xf; 0xfe < iVar14;
            iVar14 = iVar14 + -0xff) {
          *(char *)((long)psVar7 + -1) = -1;
          psVar7 = (short *)((long)psVar7 + 1);
        }
        *(char *)((long)psVar7 + -1) = (char)iVar14;
      }
      psVar29 = (short *)((ulong)(uint)((int)piVar11 - iVar30) + (long)psVar7);
      do {
        *(undefined8 *)psVar7 = *(undefined8 *)piVar22;
        psVar7 = psVar7 + 4;
        piVar22 = piVar22 + 2;
        psVar28 = (short *)dest;
      } while (psVar7 < psVar29);
      do {
        *psVar29 = (short)piVar11 - (short)pcVar17;
        dest = (char *)(psVar29 + 1);
        puVar1 = (ulong *)(piVar11 + 1);
        puVar23 = (ulong *)(pcVar17 + 4);
        puVar19 = puVar1;
        if (puVar1 < source + (long)inputSize + -0xc) {
          if (*puVar23 == *puVar1) {
            puVar23 = (ulong *)(pcVar17 + 0xc);
            puVar19 = (ulong *)(piVar11 + 3);
            goto LAB_0010a363;
          }
          uVar26 = *puVar1 ^ *puVar23;
          uVar12 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
            }
          }
          uVar12 = uVar12 >> 3 & 0x1fffffff;
          piVar22 = (int *)((long)piVar11 + uVar12 + 4);
LAB_0010a3db:
          *(char *)psVar28 = (char)*psVar28 + (char)uVar12;
          piVar11 = piVar22;
        }
        else {
LAB_0010a363:
          if (puVar19 < source + (long)inputSize + -0xc) {
            if (*puVar23 == *puVar19) goto code_r0x0010a373;
            uVar26 = *puVar19 ^ *puVar23;
            uVar12 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
              }
            }
            puVar19 = (ulong *)((long)puVar19 + (uVar12 >> 3 & 0x1fffffff));
          }
          else {
            if ((puVar19 < source + (long)inputSize + -8) && ((int)*puVar23 == (int)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 4);
              puVar23 = (ulong *)((long)puVar23 + 4);
            }
            if ((puVar19 < source + (long)inputSize + -6) && ((short)*puVar23 == (short)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 2);
              puVar23 = (ulong *)((long)puVar23 + 2);
            }
            if (puVar19 < source + (long)inputSize + -5) {
              puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar23 == (char)*puVar19));
            }
          }
          uVar12 = (long)puVar19 - (long)puVar1;
          piVar22 = (int *)((long)piVar11 + (uVar12 & 0xffffffff) + 4);
          if ((uint)uVar12 < 0xf) goto LAB_0010a3db;
          *(char *)psVar28 = (char)*psVar28 + '\x0f';
          *(short *)((long)dest + 0) = -1;
          *(short *)((long)dest + 2) = -1;
          lVar24 = 0;
          for (uVar9 = (uint)uVar12 - 0xf; 0x3fb < uVar9; uVar9 = uVar9 - 0x3fc) {
            pcVar17 = (char *)((long)psVar29 + lVar24 + 6);
            pcVar17[0] = -1;
            pcVar17[1] = -1;
            pcVar17[2] = -1;
            pcVar17[3] = -1;
            lVar24 = lVar24 + 4;
          }
          lVar6 = lVar24 + (ulong)(uVar9 & 0xffff) / 0xff;
          dest = (char *)((long)psVar29 + lVar6 + 3);
          *(char *)((long)psVar29 + lVar6 + 2) =
               (char)lVar24 + (char)((ushort)uVar9 / 0xff) + ((char)puVar19 - (char)piVar11) + -0x13
          ;
          piVar11 = piVar22;
        }
        piVar22 = piVar11;
        if (source + (long)inputSize + -0xb <= piVar11) goto LAB_0010a4a4;
        *(short *)((long)state +
                  (ulong)((uint)(*(int *)((long)piVar11 + -2) * -0x61c8864f) >> 0x13) * 2) =
             ((short)piVar11 + -2) - sVar2;
        uVar12 = (ulong)((uint)(*piVar11 * -0x61c8864f) >> 0x13);
        uVar26 = (ulong)*(ushort *)((long)state + uVar12 * 2);
        pcVar17 = (char *)(lVar20 + uVar26);
        *(short *)((long)state + uVar12 * 2) = (short)piVar11 - sVar2;
        if (*(int *)(lVar20 + uVar26) != *piVar11) goto LAB_0010a1ec;
        psVar29 = (short *)((long)dest + 1);
        *dest = '\0';
        psVar28 = (short *)dest;
      } while( true );
    }
  }
  else if ((uint)inputSize < 0x7e000001) {
    *(int *)((long)state + 0x4018) = *(int *)((long)state + 0x4018) + inputSize;
    *(uint *)((long)state + 0x4000) = inputSize + uVar9;
    *(undefined2 *)((long)state + 0x4006) = 2;
    *(uint *)((long)state + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) = uVar9;
    plVar18 = (long *)source;
LAB_00109af5:
    lVar24 = *(long *)((long)plVar18 + 1);
    iVar30 = 1;
    plVar4 = (long *)((long)plVar18 + 1);
    iVar21 = acceleration << 6;
    while( true ) {
      plVar25 = (long *)((long)iVar30 + (long)plVar4);
      plVar16 = plVar18;
      pcVar17 = dest;
      if (source + ((ulong)(uint)inputSize - 0xb) < plVar25) goto LAB_00109da4;
      uVar12 = (ulong)(lVar24 * -0x30e4432345000000) >> 0x34;
      uVar9 = *(uint *)((long)state + uVar12 * 4);
      iVar30 = (int)plVar4;
      lVar24 = *plVar25;
      *(int *)((long)state + uVar12 * 4) = iVar30 - iVar14;
      if (((uint)(iVar30 - iVar14) <= uVar9 + 0xffff) &&
         (*(int *)(lVar20 + (ulong)uVar9) == (int)*plVar4)) break;
      iVar30 = iVar21 >> 6;
      iVar21 = iVar21 + 1;
      plVar4 = plVar25;
    }
    lVar6 = (ulong)uVar9 + lVar20;
    iVar21 = (int)plVar18;
    lVar24 = 0;
    cVar3 = (char)plVar4 * '\x10' + (char)plVar18 * -0x10;
    do {
      cVar8 = cVar3;
      lVar15 = lVar24;
      piVar22 = (int *)(lVar6 + lVar15);
      plVar16 = (long *)((long)plVar4 + lVar15);
      if ((piVar22 <= source) || (plVar16 <= plVar18)) break;
      lVar24 = lVar15 + -1;
      cVar3 = cVar8 + -0x10;
    } while (*(char *)((long)plVar4 + lVar15 + -1) == *(char *)(lVar6 + -1 + lVar15));
    if ((uint)((iVar30 - iVar21) + (int)lVar15) < 0xf) {
      plVar4 = (long *)(dest + 1);
      *dest = cVar8;
    }
    else {
      *dest = -0x10;
      plVar4 = (long *)(dest + 2);
      for (iVar30 = (iVar30 - iVar21) + (int)lVar15 + -0xf; 0xfe < iVar30; iVar30 = iVar30 + -0xff)
      {
        *(char *)((long)plVar4 + -1) = -1;
        plVar4 = (long *)((long)plVar4 + 1);
      }
      *(char *)((long)plVar4 + -1) = (char)iVar30;
    }
    plVar25 = (long *)((ulong)(uint)((int)plVar16 - iVar21) + (long)plVar4);
    do {
      *plVar4 = *plVar18;
      plVar4 = plVar4 + 1;
      plVar18 = plVar18 + 1;
    } while (plVar4 < plVar25);
    do {
      *(short *)plVar25 = (short)plVar16 - (short)piVar22;
      pcVar17 = (char *)((long)plVar25 + 2);
      puVar1 = (ulong *)((long)plVar16 + 4);
      puVar23 = (ulong *)(piVar22 + 1);
      puVar19 = puVar1;
      if (puVar1 < source + ((ulong)(uint)inputSize - 0xc)) {
        if (*puVar23 == *puVar1) {
          puVar23 = (ulong *)(piVar22 + 3);
          puVar19 = (ulong *)((long)plVar16 + 0xc);
          goto LAB_00109c91;
        }
        uVar26 = *puVar1 ^ *puVar23;
        uVar12 = 0;
        if (uVar26 != 0) {
          for (; (uVar26 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
          }
        }
        uVar12 = uVar12 >> 3 & 0x1fffffff;
        plVar18 = (long *)((long)plVar16 + uVar12 + 4);
LAB_00109d09:
        *dest = *dest + (char)uVar12;
        plVar16 = plVar18;
      }
      else {
LAB_00109c91:
        if (puVar19 < source + ((ulong)(uint)inputSize - 0xc)) {
          if (*puVar23 == *puVar19) goto code_r0x00109ca1;
          uVar26 = *puVar19 ^ *puVar23;
          uVar12 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
            }
          }
          puVar19 = (ulong *)((long)puVar19 + (uVar12 >> 3 & 0x1fffffff));
        }
        else {
          if ((puVar19 < source + ((ulong)(uint)inputSize - 8)) && ((int)*puVar23 == (int)*puVar19))
          {
            puVar19 = (ulong *)((long)puVar19 + 4);
            puVar23 = (ulong *)((long)puVar23 + 4);
          }
          if ((puVar19 < source + ((ulong)(uint)inputSize - 6)) &&
             ((short)*puVar23 == (short)*puVar19)) {
            puVar19 = (ulong *)((long)puVar19 + 2);
            puVar23 = (ulong *)((long)puVar23 + 2);
          }
          if (puVar19 < source + ((ulong)(uint)inputSize - 5)) {
            puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar23 == (char)*puVar19));
          }
        }
        uVar12 = (long)puVar19 - (long)puVar1;
        plVar18 = (long *)((long)plVar16 + (uVar12 & 0xffffffff) + 4);
        if ((uint)uVar12 < 0xf) goto LAB_00109d09;
        *dest = *dest + '\x0f';
        pcVar17[0] = -1;
        pcVar17[1] = -1;
        pcVar17[2] = -1;
        pcVar17[3] = -1;
        lVar24 = 0;
        for (uVar9 = (uint)uVar12 - 0xf; 0x3fb < uVar9; uVar9 = uVar9 - 0x3fc) {
          pcVar17 = (char *)((long)plVar25 + lVar24 + 6);
          pcVar17[0] = -1;
          pcVar17[1] = -1;
          pcVar17[2] = -1;
          pcVar17[3] = -1;
          lVar24 = lVar24 + 4;
        }
        lVar6 = lVar24 + (ulong)(uVar9 & 0xffff) / 0xff;
        pcVar17 = (char *)((long)plVar25 + lVar6 + 3);
        *(char *)((long)plVar25 + lVar6 + 2) =
             (char)lVar24 + (char)((ushort)uVar9 / 0xff) + ((char)puVar19 - (char)plVar16) + -0x13;
        plVar16 = plVar18;
      }
      if (source + ((ulong)(uint)inputSize - 0xb) <= plVar16) {
LAB_00109da4:
        pcVar27 = source + ((ulong)(uint)inputSize - (long)plVar16);
        if (pcVar27 < (char *)0xf) {
          *pcVar17 = (char)pcVar27 << 4;
        }
        else {
          *pcVar17 = -0x10;
          for (pcVar5 = pcVar27 + -0xf; pcVar17 = pcVar17 + 1, (char *)0xfe < pcVar5;
              pcVar5 = pcVar5 + -0xff) {
            *pcVar17 = -1;
          }
          *pcVar17 = (char)pcVar5;
        }
        memcpy(pcVar17 + 1,plVar16,(size_t)pcVar27);
        return ((int)(pcVar17 + 1) + (int)pcVar27) - local_70;
      }
      *(int *)((long)state +
              ((ulong)(*(long *)((long)plVar16 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
           ((int)plVar16 + -2) - iVar14;
      uVar12 = (ulong)(*plVar16 * -0x30e4432345000000) >> 0x34;
      uVar10 = (int)plVar16 - iVar14;
      uVar9 = *(uint *)((long)state + uVar12 * 4);
      piVar22 = (int *)((ulong)uVar9 + lVar20);
      *(uint *)((long)state + uVar12 * 4) = uVar10;
      plVar18 = plVar16;
      dest = pcVar17;
      if ((uVar9 + 0xffff < uVar10) || (*piVar22 != (int)*plVar16)) goto LAB_00109af5;
      plVar25 = (long *)(pcVar17 + 1);
      *pcVar17 = '\0';
    } while( true );
  }
  return 0;
code_r0x00109ca1:
  puVar23 = puVar23 + 1;
  puVar19 = puVar19 + 1;
  goto LAB_00109c91;
code_r0x0010a373:
  puVar23 = puVar23 + 1;
  puVar19 = puVar19 + 1;
  goto LAB_0010a363;
code_r0x00109917:
  puVar19 = puVar19 + 1;
  puVar23 = puVar23 + 1;
  iVar30 = iVar30 + 8;
  goto LAB_00109903;
code_r0x0010a06a:
  puVar19 = puVar19 + 1;
  puVar23 = puVar23 + 1;
  iVar30 = iVar30 + 8;
  goto LAB_0010a056;
LAB_00109de1:
  pcVar27 = source + ((ulong)(uint)inputSize - (long)plVar16);
  if (pcVar17 < dest + (long)(pcVar27 + (ulong)(pcVar27 + 0xf0) / 0xff + 1)) {
    return 0;
  }
  if (pcVar27 < (char *)0xf) {
    *dest = (char)pcVar27 << 4;
  }
  else {
    *dest = -0x10;
    for (pcVar17 = pcVar27 + -0xf; dest = dest + 1, (char *)0xfe < pcVar17;
        pcVar17 = pcVar17 + -0xff) {
      *dest = -1;
    }
    *dest = (char)pcVar17;
  }
  memcpy(dest + 1,plVar16,(size_t)pcVar27);
  iVar30 = (int)(dest + 1) + (int)pcVar27;
LAB_0010a5a7:
  return iVar30 - local_70;
}

Assistant:

int LZ4_compress_fast_extState(void* state, const char* source, char* dest, int inputSize, int maxOutputSize, int acceleration)
{
    LZ4_stream_t_internal* const ctx = & LZ4_initStream(state, sizeof(LZ4_stream_t)) -> internal_donotuse;
    assert(ctx != NULL);
    if (acceleration < 1) acceleration = ACCELERATION_DEFAULT;
    if (maxOutputSize >= LZ4_compressBound(inputSize)) {
        if (inputSize < LZ4_64Klimit) {
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, 0, notLimited, byU16, noDict, noDictIssue, acceleration);
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)source > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
        }
    } else {
        if (inputSize < LZ4_64Klimit) {
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, byU16, noDict, noDictIssue, acceleration);
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)source > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, noDict, noDictIssue, acceleration);
        }
    }
}